

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertHelper *this_01;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  int i;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  size_type last_bucket_count;
  int last_element;
  size_type empty_bucket_count;
  bool *in_stack_fffffffffffffeb8;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffec0;
  unsigned_long *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffee0;
  Type in_stack_fffffffffffffeec;
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult local_108 [2];
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar3;
  AssertionResult *in_stack_ffffffffffffff38;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff40;
  AssertionResult local_90 [3];
  size_type local_60;
  AssertionResult local_58;
  size_type local_48;
  value_type local_18;
  int local_14;
  size_type local_10;
  
  bVar1 = google::
          HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_clear_no_resize
                    ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    local_10 = google::
               BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xb9d7dc);
    local_14 = 1;
    while (sVar2 = google::
                   BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xb9d7fd), sVar2 == local_10) {
      in_stack_fffffffffffffed0 = in_RDI + 0x10;
      local_18 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(in_stack_fffffffffffffec0,
                                (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      google::
      BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
      local_14 = local_14 + 1;
    }
    local_48 = google::
               BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xb9d866);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::clear_no_resize((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)0xb9d87c);
    local_60 = google::
               BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xb9d88a);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_RDI,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (unsigned_long *)in_stack_fffffffffffffec0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0);
      in_stack_fffffffffffffec8 =
           (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0xb9d8f1);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
                 (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffed0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff40,(Message *)in_stack_ffffffffffffff38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
      testing::Message::~Message((Message *)0xb9d94e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xb9d9bc);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::empty((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)0xb9d9ca);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (type *)0xb9d9ec);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_90);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffff38,
                 (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
                 (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffed0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff40,(Message *)in_stack_ffffffffffffff38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      testing::Message::~Message((Message *)0xb9dabf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xb9db56);
    for (iVar3 = 1; iVar3 < local_14; iVar3 = iVar3 + 1) {
      this_00 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)(in_RDI + 0x10);
      HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject(this_00,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      google::
      BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
      this_01 = (AssertHelper *)
                google::
                BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xb9dbb6);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (in_RDI,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(unsigned_long *)this_00
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
      if (!bVar1) {
        testing::Message::Message((Message *)this_01);
        in_stack_fffffffffffffeb8 =
             (bool *)testing::AssertionResult::failure_message((AssertionResult *)0xb9dc1d);
        testing::internal::AssertHelper::AssertHelper
                  (this_01,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
                   (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffed0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_ffffffffffffff40,(Message *)in_stack_ffffffffffffff38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        testing::Message::~Message((Message *)0xb9dc69);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xb9dccb);
    }
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ClearNoResize) {
  if (!this->ht_.supports_clear_no_resize()) return;
  typename TypeParam::size_type empty_bucket_count = this->ht_.bucket_count();
  int last_element = 1;
  while (this->ht_.bucket_count() == empty_bucket_count) {
    this->ht_.insert(this->UniqueObject(last_element));
    ++last_element;
  }
  typename TypeParam::size_type last_bucket_count = this->ht_.bucket_count();
  this->ht_.clear_no_resize();
  EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  EXPECT_TRUE(this->ht_.empty());

  // When inserting the same number of elements again, no resize
  // should be necessary.
  for (int i = 1; i < last_element; ++i) {
    this->ht_.insert(this->UniqueObject(last_element + i));
    EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  }
}